

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uncompressed_stream.cpp
# Opt level: O2

void __thiscall
minibag::UncompressedStream::decompress
          (UncompressedStream *this,uint8_t *dest,uint dest_len,uint8_t *source,uint source_len)

{
  BagException *this_00;
  allocator<char> local_39;
  string local_38;
  
  if (source_len <= dest_len) {
    memcpy(dest,source,(ulong)source_len);
    return;
  }
  this_00 = (BagException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"dest_len not large enough",&local_39);
  BagException::BagException(this_00,&local_38);
  __cxa_throw(this_00,&BagException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void UncompressedStream::decompress(uint8_t* dest, unsigned int dest_len, uint8_t* source, unsigned int source_len) {
    if (dest_len < source_len)
        throw BagException("dest_len not large enough");

    memcpy(dest, source, source_len);
}